

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveAsciiDump.h
# Opt level: O0

void __thiscall
chrono::ChArchiveAsciiDump::out
          (ChArchiveAsciiDump *this,ChNameValue<chrono::ChEnumMapperBase> *bVal)

{
  char *pcVar1;
  ChStreamOutAscii *pCVar2;
  ChEnumMapperBase *pCVar3;
  string local_38 [8];
  string mstr;
  ChNameValue<chrono::ChEnumMapperBase> *bVal_local;
  ChArchiveAsciiDump *this_local;
  
  mstr.field_2._8_8_ = bVal;
  indent(this);
  if ((this->suppress_names & 1U) == 0) {
    pCVar2 = this->ostream;
    pcVar1 = ChNameValue<chrono::ChEnumMapperBase>::name(bVal);
    pCVar2 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar2,pcVar1);
    chrono::ChStreamOutAscii::operator<<(pCVar2,"\t");
  }
  chrono::ChStreamOutAscii::operator<<(this->ostream,"\"");
  pCVar3 = ChNameValue<chrono::ChEnumMapperBase>::value(bVal);
  (*pCVar3->_vptr_ChEnumMapperBase[2])();
  chrono::ChStreamOutAscii::operator<<(this->ostream,local_38);
  chrono::ChStreamOutAscii::operator<<(this->ostream,"\"\n");
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

virtual void out     (ChNameValue<ChEnumMapperBase> bVal) {
            indent();
            if (!suppress_names) 
                (*ostream) << bVal.name() << "\t";
            (*ostream) << "\"";
            std::string mstr = bVal.value().GetValueAsString();
            (*ostream) << mstr;
            (*ostream) << "\"\n";
      }